

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmFunctionDefinition
                    (ExpressionContext *ctx,VmModule *module,ExprFunctionDefinition *node)

{
  SmallArray<VmBlock_*,_4U> *this;
  FunctionData *pFVar1;
  VmFunction *user;
  TypeFunction *pTVar2;
  SynBase *source;
  Allocator *pAVar3;
  SynIdentifier *pSVar4;
  char *__src;
  long lVar5;
  ExprBase *expression;
  VmFunction *pVVar6;
  VmBlock *pVVar7;
  long lVar8;
  int iVar9;
  VmConstant *el0;
  VmValue *pVVar10;
  undefined4 extraout_var;
  VmBlock *pVVar11;
  undefined4 extraout_var_00;
  ulong uVar12;
  uint uVar13;
  VmType type;
  TraceScope traceScope;
  VmValue *in_stack_ffffffffffffff80;
  uint uVar14;
  VmInstruction *in_stack_ffffffffffffff98;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  TraceScope local_40;
  
  pFVar1 = node->function;
  user = pFVar1->vmFunction;
  if (module->skipFunctionDefinitions == true) {
    pTVar2 = pFVar1->type;
    if (pTVar2 == (TypeFunction *)0x0) {
      __assert_fail("structType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                    ,0xd4,"static const VmType VmType::FunctionRef(TypeBase *)");
    }
    source = (node->super_ExprBase).source;
    el0 = CreateConstantPointer
                    (module->allocator,source,0,(VariableData *)0x0,ctx->typeNullPtr,false);
    type.structType = &pTVar2->super_TypeBase;
    type.type = VM_TYPE_FUNCTION_REF;
    type.size = 0xc;
    pVVar10 = anon_unknown.dwarf_107107::CreateConstruct
                        (module,source,type,&el0->super_VmValue,&user->super_VmValue,(VmValue *)0x0,
                         in_stack_ffffffffffffff80);
    anon_unknown.dwarf_107107::CheckType(ctx,(ExprBase *)(node->super_ExprBase).type,pVVar10);
  }
  else if (pFVar1->isPrototype == true) {
    iVar9 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
    pVVar10 = (VmValue *)CONCAT44(extraout_var,iVar9);
    pAVar3 = module->allocator;
    pVVar10->typeID = 0;
    pVVar10->source = (SynBase *)0x0;
    (pVVar10->comment).begin = (char *)0x0;
    (pVVar10->type).type = VM_TYPE_VOID;
    (pVVar10->type).size = 0;
    (pVVar10->type).structType = (TypeBase *)0x0;
    (pVVar10->comment).end = (char *)0x0;
    (pVVar10->users).allocator = pAVar3;
    (pVVar10->users).data = (pVVar10->users).little;
    (pVVar10->users).count = 0;
    (pVVar10->users).max = 8;
    pVVar10->hasKnownNonSimpleUse = false;
    pVVar10->hasSideEffects = false;
    pVVar10->hasMemoryAccess = false;
    pVVar10->canBeRemoved = true;
    pVVar10->hasKnownSimpleUse = false;
    pVVar10->_vptr_VmValue = (_func_int **)&PTR__VmValue_00224c70;
  }
  else {
    if ((CompileVmFunctionDefinition(ExpressionContext&,VmModule*,ExprFunctionDefinition*)::token ==
         '\0') &&
       (iVar9 = __cxa_guard_acquire(&CompileVmFunctionDefinition(ExpressionContext&,VmModule*,ExprFunctionDefinition*)
                                     ::token), iVar9 != 0)) {
      CompileVmFunctionDefinition::token =
           NULLC::TraceGetToken("InstructionTreeVm","CompileVmFunctionDefinition");
      __cxa_guard_release(&CompileVmFunctionDefinition(ExpressionContext&,VmModule*,ExprFunctionDefinition*)
                           ::token);
    }
    NULLC::TraceScope::TraceScope(&local_40,CompileVmFunctionDefinition::token);
    lVar8 = NULLC::traceContext;
    if ((user->function != (FunctionData *)0x0) &&
       (pSVar4 = user->function->name, pSVar4 != (SynIdentifier *)0x0)) {
      __src = (pSVar4->name).begin;
      uVar12 = (long)(pSVar4->name).end - (long)__src;
      iVar9 = (int)uVar12;
      if (iVar9 != 0) {
        in_stack_ffffffffffffff98 =
             (VmInstruction *)CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),iVar9 + 1);
        uVar13 = *(uint *)(NULLC::traceContext + 0x264);
        if ((uVar13 <= (uint)(*(int *)(NULLC::traceContext + 0x260) + iVar9 + 1)) ||
           (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
          NULLC::TraceDump();
          uVar13 = *(uint *)(lVar8 + 0x264);
        }
        uVar14 = (uint)in_stack_ffffffffffffff98;
        if (uVar13 <= uVar14) {
          __assert_fail("count + 1 < context.labels.max",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                        ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
        }
        uVar13 = *(uint *)(lVar8 + 0x260);
        memcpy((void *)((ulong)uVar13 + *(long *)(lVar8 + 0x268)),__src,uVar12 & 0xffffffff);
        *(undefined1 *)(*(long *)(lVar8 + 0x268) + (ulong)(uint)(*(int *)(lVar8 + 0x260) + iVar9)) =
             0;
        *(int *)(lVar8 + 0x260) = *(int *)(lVar8 + 0x260) + uVar14;
        lVar5 = *(long *)(lVar8 + 0x278);
        uVar14 = *(uint *)(lVar8 + 0x270);
        *(uint *)(lVar8 + 0x270) = uVar14 + 1;
        *(uint *)(lVar5 + (ulong)uVar14 * 8) = uVar13 * 4 + 2;
        *(undefined4 *)(lVar5 + 4 + (ulong)uVar14 * 8) = 0;
      }
    }
    module->skipFunctionDefinitions = true;
    pVVar6 = module->currentFunction;
    pVVar7 = module->currentBlock;
    module->currentFunction = user;
    pVVar11 = anon_unknown.dwarf_107107::CreateBlock(module,(node->super_ExprBase).source,"start");
    VmFunction::AddBlock(module->currentFunction,pVVar11);
    module->currentBlock = pVVar11;
    VmValue::AddUse(&pVVar11->super_VmValue,&user->super_VmValue);
    if (node->function->coroutine == true) {
      pVVar10 = CompileVm(ctx,module,node->coroutineStateRead);
      in_stack_ffffffffffffff98 =
           anon_unknown.dwarf_107107::CreateInstruction
                     ((anon_unknown_dwarf_107107 *)module,(VmModule *)(node->super_ExprBase).source,
                      (SynBase *)0x0,(VmType)(ZEXT816(0x4c) << 0x40),(VmInstructionType)pVVar10,
                      (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                      &in_stack_ffffffffffffff98->super_VmValue);
      pVVar11 = anon_unknown.dwarf_107107::CreateBlock
                          (module,(node->super_ExprBase).source,"co_start");
      VmInstruction::AddArgument(in_stack_ffffffffffffff98,&pVVar11->super_VmValue);
      VmFunction::AddBlock(module->currentFunction,pVVar11);
      module->currentBlock = pVVar11;
      this = &user->restoreBlocks;
      uVar13 = (user->restoreBlocks).count;
      if (uVar13 == (user->restoreBlocks).max) {
        SmallArray<VmBlock_*,_4U>::grow(this,uVar13);
      }
      if (this->data == (VmBlock **)0x0) {
LAB_001993e6:
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<VmBlock *, 4>::push_back(const T &) [T = VmBlock *, N = 4]");
      }
      uVar13 = (user->restoreBlocks).count;
      (user->restoreBlocks).count = uVar13 + 1;
      this->data[uVar13] = pVVar11;
      if (node->function->yieldCount != 0) {
        uVar13 = 0;
        do {
          pVVar11 = anon_unknown.dwarf_107107::CreateBlock
                              (module,(node->super_ExprBase).source,"restore");
          VmInstruction::AddArgument(in_stack_ffffffffffffff98,&pVVar11->super_VmValue);
          uVar14 = (user->restoreBlocks).count;
          if (uVar14 == (user->restoreBlocks).max) {
            SmallArray<VmBlock_*,_4U>::grow(this,uVar14);
          }
          if (this->data == (VmBlock **)0x0) goto LAB_001993e6;
          uVar14 = (user->restoreBlocks).count;
          (user->restoreBlocks).count = uVar14 + 1;
          this->data[uVar14] = pVVar11;
          uVar13 = uVar13 + 1;
        } while (uVar13 < node->function->yieldCount);
      }
    }
    for (expression = (node->expressions).head; expression != (ExprBase *)0x0;
        expression = expression->next) {
      CompileVm(ctx,module,expression);
    }
    anon_unknown.dwarf_107107::CreateInstruction
              ((anon_unknown_dwarf_107107 *)module,(VmModule *)0x0,(SynBase *)0x0,
               (VmType)(ZEXT816(0x48) << 0x40),VM_INST_LOAD_BYTE,(VmValue *)0x0,(VmValue *)0x0,
               (VmValue *)0x0,(VmValue *)0x0,&in_stack_ffffffffffffff98->super_VmValue);
    local_58 = SUB84(pVVar6,0);
    uStack_54 = (undefined4)((ulong)pVVar6 >> 0x20);
    uStack_50 = SUB84(pVVar7,0);
    uStack_4c = (undefined4)((ulong)pVVar7 >> 0x20);
    *(undefined4 *)&module->currentFunction = local_58;
    *(undefined4 *)((long)&module->currentFunction + 4) = uStack_54;
    *(undefined4 *)&module->currentBlock = uStack_50;
    *(undefined4 *)((long)&module->currentBlock + 4) = uStack_4c;
    module->skipFunctionDefinitions = false;
    iVar9 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
    pVVar10 = (VmValue *)CONCAT44(extraout_var_00,iVar9);
    pAVar3 = module->allocator;
    pVVar10->typeID = 0;
    (pVVar10->type).type = VM_TYPE_VOID;
    (pVVar10->type).size = 0;
    (pVVar10->type).structType = (TypeBase *)0x0;
    pVVar10->source = (SynBase *)0x0;
    (pVVar10->comment).begin = (char *)0x0;
    (pVVar10->comment).end = (char *)0x0;
    (pVVar10->users).allocator = pAVar3;
    (pVVar10->users).data = (pVVar10->users).little;
    (pVVar10->users).count = 0;
    (pVVar10->users).max = 8;
    pVVar10->hasKnownNonSimpleUse = false;
    pVVar10->hasSideEffects = false;
    pVVar10->hasMemoryAccess = false;
    pVVar10->canBeRemoved = true;
    pVVar10->hasKnownSimpleUse = false;
    pVVar10->_vptr_VmValue = (_func_int **)&PTR__VmValue_00224c70;
    NULLC::TraceScope::~TraceScope(&local_40);
  }
  return pVVar10;
}

Assistant:

VmValue* CompileVmFunctionDefinition(ExpressionContext &ctx, VmModule *module, ExprFunctionDefinition *node)
{
	VmFunction *function = node->function->vmFunction;

	if(module->skipFunctionDefinitions)
		return CheckType(ctx, node, CreateConstruct(module, node->source, VmType::FunctionRef(node->function->type), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), function, NULL, NULL));

	if(node->function->isPrototype)
		return CreateVoid(module);

	TRACE_SCOPE("InstructionTreeVm", "CompileVmFunctionDefinition");

	if(function->function && function->function->name)
		TRACE_LABEL2(function->function->name->name.begin, function->function->name->name.end);

	module->skipFunctionDefinitions = true;

	// Store state
	VmFunction *currentFunction = module->currentFunction;
	VmBlock *currentBlock = module->currentBlock;

	// Switch to new function
	module->currentFunction = function;

	VmBlock *block = CreateBlock(module, node->source, "start");

	module->currentFunction->AddBlock(block);
	module->currentBlock = block;
	block->AddUse(function);

	if(node->function->coroutine)
	{
		VmValue *state = CompileVm(ctx, module, node->coroutineStateRead);

		VmInstruction *inst = CreateInstruction(module, node->source, VmType::Void, VM_INST_UNYIELD, state, NULL, NULL, NULL);

		{
			VmBlock *block = CreateBlock(module, node->source, "co_start");

			inst->AddArgument(block);

			module->currentFunction->AddBlock(block);
			module->currentBlock = block;

			function->restoreBlocks.push_back(block);
		}

		for(unsigned i = 0; i < node->function->yieldCount; i++)
		{
			VmBlock *block = CreateBlock(module, node->source, "restore");

			inst->AddArgument(block);

			function->restoreBlocks.push_back(block);
		}
	}

	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileVm(ctx, module, value);

	CreateAbortNoReturn(module, NULL);

	// Restore state
	module->currentFunction = currentFunction;
	module->currentBlock = currentBlock;

	module->skipFunctionDefinitions = false;

	return CreateVoid(module);
}